

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce-operations.hpp
# Opt level: O2

void diy::all_to_all<void(*)(void*,diy::ReduceProxy_const&)>
               (Master *master,Assigner *assigner,_func_void_void_ptr_ReduceProxy_ptr **op,int k)

{
  _Vector_base<int,_std::allocator<int>_> local_2e8;
  _Vector_base<int,_std::allocator<int>_> local_2c8;
  SkipIntermediate local_2b0;
  string local_2a8;
  _Bvector_base<std::allocator<bool>_> local_288;
  _Bvector_base<std::allocator<bool>_> local_258;
  RegularSwapPartners partners;
  Scoped scoped;
  AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> local_178;
  RegularDecomposer<diy::Bounds<int>_> decomposer;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"all_to_all",(allocator<char> *)&decomposer);
  stats::Profiler::scoped(&scoped,&master->prof,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  interval((DiscreteBounds *)&partners,0,assigner->nblocks_ + -1);
  local_258._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_258._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_258._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
  local_258._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_258._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_258._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
  local_258._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_288._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_288._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_288._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_288._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
  local_288._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_288._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_288._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
  local_2c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
            (&decomposer,1,(Bounds *)&partners,assigner->nblocks_,(BoolVector *)&local_258,
             (BoolVector *)&local_288,(CoordinateVector *)&local_2c8,(DivisionsVector *)&local_2e8);
  Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2e8);
  Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2c8);
  Catch::clara::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_288);
  Catch::clara::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_258);
  Bounds<int>::~Bounds((Bounds<int> *)&partners);
  RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
            (&partners.super_RegularPartners,&decomposer,k,false);
  detail::AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)>::AllToAllReduce
            (&local_178,op,assigner);
  local_2b0.rounds =
       (long)partners.super_RegularPartners.kvs_.
             super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)partners.super_RegularPartners.kvs_.
             super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  reduce<diy::detail::AllToAllReduce<void(*)(void*,diy::ReduceProxy_const&)>,diy::RegularSwapPartners,diy::detail::SkipIntermediate>
            (master,assigner,&partners,&local_178,&local_2b0);
  detail::AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)>::~AllToAllReduce(&local_178);
  RegularPartners::~RegularPartners(&partners.super_RegularPartners);
  RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(&decomposer);
  stats::ScopedProfile<diy::stats::Profiler>::~ScopedProfile(&scoped);
  return;
}

Assistant:

void
all_to_all(Master&              master,     //!< block owner
           const Assigner&      assigner,   //!< global block locator (maps gid to proc)
           const Op&            op,         //!< user-defined operation called to enqueue and dequeue items
           int                  k = 2       //!< reduction fanout
          )
{
  auto scoped = master.prof.scoped("all_to_all");
  (void)scoped;
  RegularDecomposer<DiscreteBounds> decomposer(1, interval(0,assigner.nblocks()-1), assigner.nblocks());
  RegularSwapPartners  partners(decomposer, k, false);
  reduce(master, assigner, partners, detail::AllToAllReduce<Op>(op, assigner), detail::SkipIntermediate(partners.rounds()));
}